

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  Mpm_Uni_t *Entry;
  int iVar1;
  Mpm_Cut_t *pMVar2;
  long lVar3;
  uint uVar4;
  Mpm_Cut_t *pMVar5;
  Mpm_Cut_t *pCut;
  Mpm_Cut_t *local_40;
  Mig_Obj_t *local_38;
  
  local_40 = (Mpm_Cut_t *)0x0;
  uVar4 = (uint)pObj->pFans[3] >> 1;
  if ((p->vCutLists).nSize <= (int)uVar4) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  iVar1 = p->nCutStore;
  if ((iVar1 < 1) || (p->nNumCuts < iVar1)) {
    __assert_fail("p->nCutStore > 0 && p->nCutStore <= p->nNumCuts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0x228,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
  }
  pMVar5 = (Mpm_Cut_t *)((p->vCutLists).pArray + uVar4);
  local_38 = pObj;
  if (pMVar5->hNext != 0) {
    __assert_fail("*pList == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0x229,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
  }
  pMVar2 = (Mpm_Cut_t *)0x0;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    Entry = p->pCutStore[lVar3];
    iVar1 = Mpm_CutCreate(p,&Entry->pCut,&local_40);
    pMVar2 = local_40;
    pMVar5->hNext = iVar1;
    Vec_PtrPush(&p->vFreeUnits,Entry);
    iVar1 = p->nCutStore;
    pMVar5 = pMVar2;
  }
  if ((p->vFreeUnits).nSize == p->nNumCuts + 1) {
    if ((iVar1 != 1) || (iVar1 = 0, 0xfffffff < *(uint *)&pMVar2->field_0x4)) {
      iVar1 = Mpm_CutCreateUnit(p,(uint)local_38->pFans[3] >> 1);
    }
    pMVar5->hNext = iVar1;
    return;
  }
  __assert_fail("Vec_PtrSize(&p->vFreeUnits) == p->nNumCuts + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                ,0x232,"void Mpm_ObjTranslateCutsFromStore(Mpm_Man_t *, Mig_Obj_t *)");
}

Assistant:

void Mpm_ObjTranslateCutsFromStore( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut = NULL;
    Mpm_Uni_t * pUnit;
    int i, *pList = Mpm_ObjCutListP( p, pObj );
    assert( p->nCutStore > 0 && p->nCutStore <= p->nNumCuts );
    assert( *pList == 0 );
    // translate cuts
    for ( i = 0; i < p->nCutStore; i++ )
    {
        pUnit  = p->pCutStore[i];
        *pList = Mpm_CutCreate( p, &pUnit->pCut, &pCut );
        pList  = &pCut->hNext;
        Vec_PtrPush( &p->vFreeUnits, pUnit );
    }
    assert( Vec_PtrSize(&p->vFreeUnits) == p->nNumCuts + 1 );
    if ( p->nCutStore == 1 && pCut->nLeaves < 2 )
        *pList = 0;
    else
        *pList = Mpm_CutCreateUnit( p, Mig_ObjId(pObj) );
}